

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMaterialSystem.cpp
# Opt level: O0

void __thiscall
MaterialSystemTest_testColorProperty_Test::TestBody(MaterialSystemTest_testColorProperty_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  bool bVar1;
  char *message;
  char *pcVar2;
  string local_a0;
  AssertHelper local_80;
  Message local_78;
  bool local_69;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_;
  Message local_50 [3];
  aiReturn local_38 [2];
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  aiColor4D clr;
  MaterialSystemTest_testColorProperty_Test *this_local;
  
  this_00 = &gtest_ar.message_;
  aiColor4t<float>::aiColor4t((aiColor4t<float> *)this_00);
  gtest_ar.message_.ptr_._0_4_ = 0x40000000;
  gtest_ar.message_.ptr_._4_4_ = 0x40400000;
  pcVar2 = (char *)0x0;
  aiMaterial::AddProperty
            ((this->super_MaterialSystemTest).pcMat,(aiColor4D *)this_00,1,"testKey5",0,0);
  gtest_ar.message_.ptr_._0_4_ = 0;
  gtest_ar.message_.ptr_._4_4_ = 0;
  local_38[1] = 0;
  local_38[0] = aiMaterial::Get((this->super_MaterialSystemTest).pcMat,"testKey5",0,0,
                                (aiColor4D *)this_00);
  testing::internal::EqHelper<false>::Compare<aiReturn,aiReturn>
            ((EqHelper<false> *)local_30,"aiReturn_SUCCESS","pcMat->Get(\"testKey5\",0,0,clr)",
             local_38 + 1,local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_50);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x75,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  local_69 = false;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_68,&local_69,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(internal *)local_68,
               (AssertionResult *)"clr.r == 2.0f && clr.g == 3.0f && clr.b == 4.0f && clr.a == 5.0f"
               ,"false","true",pcVar2);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x76,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  return;
}

Assistant:

TEST_F(MaterialSystemTest, testColorProperty)
{
    aiColor4D clr;
    clr.r = 2.0f;clr.g = 3.0f;clr.b = 4.0f;clr.a = 5.0f;
    this->pcMat->AddProperty(&clr,1,"testKey5");
    clr.b = 1.0f;
    clr.a = clr.g = clr.r = 0.0f;

    EXPECT_EQ(AI_SUCCESS, pcMat->Get("testKey5",0,0,clr));
    EXPECT_TRUE(clr.r == 2.0f && clr.g == 3.0f && clr.b == 4.0f && clr.a == 5.0f);
}